

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall
QPlainTextEditControl::insertFromMimeData(QPlainTextEditControl *this,QMimeData *source)

{
  long *plVar1;
  undefined1 auVar2 [16];
  
  auVar2 = QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject);
  plVar1 = auVar2._0_8_;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x1e0))(plVar1,source,auVar2._8_8_,*(code **)(*plVar1 + 0x1e0));
    return;
  }
  QWidgetTextControl::insertFromMimeData((QWidgetTextControl *)this,source);
  return;
}

Assistant:

void QPlainTextEditControl::insertFromMimeData(const QMimeData *source) {
    QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
    if (!ed)
        QWidgetTextControl::insertFromMimeData(source);
    else
        ed->insertFromMimeData(source);
}